

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O3

bool __thiscall
density::detail::
LFQueue_Head<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::Consume::is_queue_empty
          (Consume *this,
          LFQueue_Head<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          *i_queue)

{
  ControlBlock *pCVar1;
  ulong uVar2;
  bool bVar3;
  
  if (0xf < this->m_next_ptr) {
    density_tests::detail::assert_failed<>
              ("empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
               ,0x99);
  }
  pCVar1 = i_queue->m_head;
  if (pCVar1 == (ControlBlock *)0x0) {
    pCVar1 = (i_queue->
             super_LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ).m_initial_page._M_b._M_p;
    i_queue->m_head = pCVar1;
    if (pCVar1 == (ControlBlock *)0x0) {
      this->m_next_ptr = 0;
      return true;
    }
  }
  this->m_queue = i_queue;
  this->m_control = pCVar1;
  uVar2 = pCVar1->m_next;
  this->m_next_ptr = uVar2;
  bVar3 = uVar2 < 0x10;
  if ((uVar2 & 0xb) != 0 && !bVar3) {
    do {
      this->m_control = (ControlBlock *)(uVar2 & 0xfffffffffffffff0);
      uVar2 = ((ControlBlock *)(uVar2 & 0xfffffffffffffff0))->m_next;
      this->m_next_ptr = uVar2;
      bVar3 = uVar2 < 0x10;
      if (bVar3) {
        return bVar3;
      }
    } while ((uVar2 & 0xb) != 0);
  }
  return bVar3;
}

Assistant:

bool is_queue_empty(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSERT_INTERNAL(empty());

                    begin_iteration(i_queue);
                    while (!empty())
                    {
                        if (
                          (m_next_ptr & (LfQueue_Busy | LfQueue_Dead | LfQueue_InvalidNextPage)) ==
                          0)
                        {
                            return false;
                        }
                        move_next();
                    }
                    return true;
                }